

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

bool __thiscall
Reducer::shrinkByReduction<wasm::ElementSegment>(Reducer *this,ElementSegment *segment,size_t bonus)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> save;
  
  if (*(long *)(segment + 0x40) != *(long *)(segment + 0x38)) {
    uVar7 = 1;
    bVar2 = false;
    uVar8 = 0;
    do {
      if ((bVar2) || (bVar2 = shouldTryToReduce(this,bonus), bVar2)) {
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   (segment + 0x38));
        if (uVar7 != 0) {
          lVar5 = *(long *)(segment + 0x40);
          uVar6 = uVar7;
          do {
            if (lVar5 == *(long *)(segment + 0x38)) break;
            lVar5 = lVar5 + -8;
            *(long *)(segment + 0x40) = lVar5;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        bVar3 = writeAndTestReduction(this);
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"|      shrank segment from ",0x1b);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," => ",4);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," (skip: ",8);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
          this->reduced = this->reduced + 1;
          applyTestToWorking(this);
          uVar7 = uVar7 * 2;
          if ((ulong)(long)this->factor <= uVar7) {
            uVar7 = (long)this->factor;
          }
        }
        else {
          pvVar1 = *(void **)(segment + 0x38);
          lVar5 = *(long *)(segment + 0x48);
          *(undefined1 (*) [8])(segment + 0x38) = auStack_58;
          *(pointer *)(segment + 0x40) =
               save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
          *(pointer *)(segment + 0x48) =
               save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          auStack_58 = (undefined1  [8])0x0;
          save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pvVar1 == (void *)0x0) {
            return false;
          }
          operator_delete(pvVar1,lVar5 - (long)pvVar1);
        }
        if (auStack_58 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_58,
                          (long)save.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
        }
        bVar2 = true;
        if (!bVar3) {
          return false;
        }
      }
      else {
        bVar2 = false;
      }
    } while ((*(long *)(segment + 0x40) - *(long *)(segment + 0x38) != 0) &&
            (uVar8 = uVar8 + 1,
            uVar8 < (ulong)(*(long *)(segment + 0x40) - *(long *)(segment + 0x38) >> 3)));
  }
  return true;
}

Assistant:

bool shrinkByReduction(T* segment, size_t bonus) {
    // try to reduce to first function. first, shrink segment elements.
    // while we are shrinking successfully, keep going exponentially.
    bool justShrank = false;

    auto& data = segment->data;
    // when we succeed, try to shrink by more and more, similar to bisection
    size_t skip = 1;
    for (size_t i = 0; i < data.size() && !data.empty(); i++) {
      if (justShrank || shouldTryToReduce(bonus)) {
        auto save = data;
        for (size_t j = 0; j < skip; j++) {
          if (data.empty()) {
            break;
          } else {
            data.pop_back();
          }
        }
        justShrank = writeAndTestReduction();
        if (justShrank) {
          std::cerr << "|      shrank segment from " << save.size() << " => "
                    << data.size() << " (skip: " << skip << ")\n";
          noteReduction();
          skip = std::min(size_t(factor), 2 * skip);
        } else {
          data = std::move(save);
          return false;
        }
      }
    }

    return true;
  }